

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O0

void Fra_AddClausesMux(Fra_Man_t *p,Aig_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  int v;
  int v_00;
  uint c;
  uint c_00;
  int iVar3;
  Aig_Obj_t *pAVar4;
  int fCompE;
  int fCompT;
  int VarE;
  int VarT;
  int VarI;
  int VarF;
  int RetValue;
  int pLits [4];
  Aig_Obj_t *local_30;
  Aig_Obj_t *pNodeE;
  Aig_Obj_t *pNodeT;
  Aig_Obj_t *pNodeI;
  Aig_Obj_t *pNode_local;
  Fra_Man_t *p_local;
  
  pNodeI = pNode;
  pNode_local = (Aig_Obj_t *)p;
  iVar1 = Aig_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0x33,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsMuxType(pNodeI);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0x34,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
  }
  pNodeT = Aig_ObjRecognizeMux(pNodeI,&pNodeE,&local_30);
  iVar1 = Fra_ObjSatNum(pNodeI);
  iVar2 = Fra_ObjSatNum(pNodeT);
  pAVar4 = Aig_Regular(pNodeE);
  v = Fra_ObjSatNum(pAVar4);
  pAVar4 = Aig_Regular(local_30);
  v_00 = Fra_ObjSatNum(pAVar4);
  c = Aig_IsComplement(pNodeE);
  c_00 = Aig_IsComplement(local_30);
  VarF = toLitCond(iVar2,1);
  RetValue = toLitCond(v,c ^ 1);
  pLits[0] = toLitCond(iVar1,0);
  iVar3 = sat_solver_addclause((sat_solver *)pNode_local[2].pFanin0,&VarF,pLits + 1);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0x4c,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
  }
  VarF = toLitCond(iVar2,1);
  RetValue = toLitCond(v,c);
  pLits[0] = toLitCond(iVar1,1);
  iVar3 = sat_solver_addclause((sat_solver *)pNode_local[2].pFanin0,&VarF,pLits + 1);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0x51,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
  }
  VarF = toLitCond(iVar2,0);
  RetValue = toLitCond(v_00,c_00 ^ 1);
  pLits[0] = toLitCond(iVar1,0);
  iVar3 = sat_solver_addclause((sat_solver *)pNode_local[2].pFanin0,&VarF,pLits + 1);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0x56,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
  }
  VarF = toLitCond(iVar2,0);
  RetValue = toLitCond(v_00,c_00);
  pLits[0] = toLitCond(iVar1,1);
  iVar2 = sat_solver_addclause((sat_solver *)pNode_local[2].pFanin0,&VarF,pLits + 1);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0x5b,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
  }
  if (v != v_00) {
    VarF = toLitCond(v,c);
    RetValue = toLitCond(v_00,c_00);
    pLits[0] = toLitCond(iVar1,1);
    iVar2 = sat_solver_addclause((sat_solver *)pNode_local[2].pFanin0,&VarF,pLits + 1);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                    ,0x6e,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
    }
    VarF = toLitCond(v,c ^ 1);
    RetValue = toLitCond(v_00,c_00 ^ 1);
    pLits[0] = toLitCond(iVar1,0);
    iVar1 = sat_solver_addclause((sat_solver *)pNode_local[2].pFanin0,&VarF,pLits + 1);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                    ,0x73,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Addes clauses to the solver.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fra_AddClausesMux( Fra_Man_t * p, Aig_Obj_t * pNode )
{
    Aig_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Aig_IsComplement( pNode ) );
    assert( Aig_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Aig_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Fra_ObjSatNum(pNode);
    VarI = Fra_ObjSatNum(pNodeI);
    VarT = Fra_ObjSatNum(Aig_Regular(pNodeT));
    VarE = Fra_ObjSatNum(Aig_Regular(pNodeE));
    // get the complementation flags
    fCompT = Aig_IsComplement(pNodeT);
    fCompE = Aig_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}